

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Expression *pEVar2;
  Return *pRVar3;
  ulong extraout_RDX;
  Type type_00;
  
  if (type.id < 2) {
    if (type.id != 0) {
      ::wasm::HeapType::getSignature();
      if (extraout_RDX < 2) {
        pEVar2 = (Expression *)0x0;
      }
      else {
        ::wasm::HeapType::getSignature();
        pEVar2 = makeTrivial(this,type_00);
      }
      pRVar3 = Builder::makeReturn(&this->builder,pEVar2);
      return (Expression *)pRVar3;
    }
    pEVar2 = makeNop(this,(Type)0x0);
    return pEVar2;
  }
  bVar1 = Random::oneIn(&this->random,2);
  if ((bVar1) && (this->funcContext != (FunctionCreationContext *)0x0)) {
    pEVar2 = makeLocalGet(this,type);
    return pEVar2;
  }
  pEVar2 = makeConst(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  if (type.isConcrete()) {
    if (oneIn(2) && funcContext) {
      return makeLocalGet(type);
    } else {
      return makeConst(type);
    }
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}